

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error processXmlDecl(XML_Parser parser,int isGeneralTextEntity,char *s,char *next)

{
  char **badPtr;
  ENCODING *pEVar1;
  block *pbVar2;
  char *pcVar3;
  int iVar4;
  XML_Error XVar5;
  XML_Char *encodingName_00;
  XML_Char *pXVar6;
  BLOCK *pBVar7;
  BLOCK *pBVar8;
  bool bVar9;
  int standalone;
  char *encodingName;
  char *versionend;
  char *version;
  ENCODING *newEncoding;
  
  encodingName = (char *)0x0;
  newEncoding = (ENCODING *)0x0;
  version = (char *)0x0;
  standalone = -1;
  badPtr = &parser->m_eventPtr;
  iVar4 = XmlParseXmlDecl(isGeneralTextEntity,parser->m_encoding,s,next,badPtr,&version,&versionend,
                          &encodingName,&newEncoding,&standalone);
  pcVar3 = encodingName;
  if (iVar4 == 0) {
    return XML_ERROR_TEXT_DECL - (isGeneralTextEntity == 0);
  }
  if ((isGeneralTextEntity == 0) && (standalone == 1)) {
    parser->m_dtd->standalone = '\x01';
  }
  if (parser->m_xmlDeclHandler == (XML_XmlDeclHandler)0x0) {
    if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
      reportDefault(parser,parser->m_encoding,s,next);
    }
    encodingName_00 = (XML_Char *)0x0;
    bVar9 = false;
  }
  else {
    if (encodingName == (char *)0x0) {
      encodingName_00 = (XML_Char *)0x0;
    }
    else {
      pEVar1 = parser->m_encoding;
      iVar4 = (*pEVar1->nameLength)(pEVar1,encodingName);
      encodingName_00 = poolStoreString(&parser->m_temp2Pool,pEVar1,pcVar3,pcVar3 + iVar4);
      if (encodingName_00 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      (parser->m_temp2Pool).start = (parser->m_temp2Pool).ptr;
    }
    if (version == (char *)0x0) {
      pXVar6 = (XML_Char *)0x0;
    }
    else {
      pXVar6 = poolStoreString(&parser->m_temp2Pool,parser->m_encoding,version,
                               versionend + -(long)parser->m_encoding->minBytesPerChar);
      if (pXVar6 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    (*parser->m_xmlDeclHandler)(parser->m_handlerArg,pXVar6,encodingName_00,standalone);
    bVar9 = pXVar6 != (XML_Char *)0x0;
  }
  pcVar3 = encodingName;
  if (parser->m_protocolEncodingName == (XML_Char *)0x0) {
    if (newEncoding == (ENCODING *)0x0) {
      if (encodingName != (char *)0x0) {
        if (encodingName_00 == (XML_Char *)0x0) {
          pEVar1 = parser->m_encoding;
          iVar4 = (*pEVar1->nameLength)(pEVar1,encodingName);
          encodingName_00 = poolStoreString(&parser->m_temp2Pool,pEVar1,pcVar3,pcVar3 + iVar4);
          if (encodingName_00 == (XML_Char *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
        }
        XVar5 = handleUnknownEncoding(parser,encodingName_00);
        pBVar8 = (parser->m_temp2Pool).blocks;
        pBVar7 = (parser->m_temp2Pool).freeBlocks;
        if (pBVar7 != (BLOCK *)0x0) {
          pbVar2 = pBVar8;
          if (pBVar8 == (BLOCK *)0x0) goto LAB_0045a9ef;
          do {
            pBVar8 = pbVar2;
            pbVar2 = pBVar8->next;
            pBVar8->next = pBVar7;
            pBVar7 = pBVar8;
          } while (pbVar2 != (block *)0x0);
        }
        (parser->m_temp2Pool).freeBlocks = pBVar8;
LAB_0045a9ef:
        (parser->m_temp2Pool).blocks = (BLOCK *)0x0;
        (parser->m_temp2Pool).end = (XML_Char *)0x0;
        (parser->m_temp2Pool).ptr = (XML_Char *)0x0;
        (parser->m_temp2Pool).start = (XML_Char *)0x0;
        if (XVar5 == XML_ERROR_UNKNOWN_ENCODING) {
          *badPtr = encodingName;
          return XML_ERROR_UNKNOWN_ENCODING;
        }
        return XVar5;
      }
    }
    else {
      if ((newEncoding->minBytesPerChar != parser->m_encoding->minBytesPerChar) ||
         (newEncoding != parser->m_encoding && newEncoding->minBytesPerChar == 2)) {
        *badPtr = encodingName;
        return XML_ERROR_INCORRECT_ENCODING;
      }
      parser->m_encoding = newEncoding;
    }
  }
  if ((bool)(encodingName_00 == (XML_Char *)0x0 & (bVar9 ^ 1U))) {
    return XML_ERROR_NONE;
  }
  pBVar8 = (parser->m_temp2Pool).blocks;
  pBVar7 = (parser->m_temp2Pool).freeBlocks;
  if (pBVar7 != (BLOCK *)0x0) {
    pbVar2 = pBVar8;
    if (pBVar8 == (BLOCK *)0x0) goto LAB_0045a9bc;
    do {
      pBVar8 = pbVar2;
      pbVar2 = pBVar8->next;
      pBVar8->next = pBVar7;
      pBVar7 = pBVar8;
    } while (pbVar2 != (block *)0x0);
  }
  (parser->m_temp2Pool).freeBlocks = pBVar8;
LAB_0045a9bc:
  (parser->m_temp2Pool).blocks = (BLOCK *)0x0;
  (parser->m_temp2Pool).end = (XML_Char *)0x0;
  (parser->m_temp2Pool).ptr = (XML_Char *)0x0;
  (parser->m_temp2Pool).start = (XML_Char *)0x0;
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error
processXmlDecl(XML_Parser parser, int isGeneralTextEntity,
               const char *s, const char *next)
{
  const char *encodingName = NULL;
  const XML_Char *storedEncName = NULL;
  const ENCODING *newEncoding = NULL;
  const char *version = NULL;
  const char *versionend;
  const XML_Char *storedversion = NULL;
  int standalone = -1;
  if (!(parser->m_ns
        ? XmlParseXmlDeclNS
        : XmlParseXmlDecl)(isGeneralTextEntity,
                           parser->m_encoding,
                           s,
                           next,
                           &parser->m_eventPtr,
                           &version,
                           &versionend,
                           &encodingName,
                           &newEncoding,
                           &standalone)) {
    if (isGeneralTextEntity)
      return XML_ERROR_TEXT_DECL;
    else
      return XML_ERROR_XML_DECL;
  }
  if (!isGeneralTextEntity && standalone == 1) {
    parser->m_dtd->standalone = XML_TRUE;
#ifdef XML_DTD
    if (parser->m_paramEntityParsing == XML_PARAM_ENTITY_PARSING_UNLESS_STANDALONE)
      parser->m_paramEntityParsing = XML_PARAM_ENTITY_PARSING_NEVER;
#endif /* XML_DTD */
  }
  if (parser->m_xmlDeclHandler) {
    if (encodingName != NULL) {
      storedEncName = poolStoreString(&parser->m_temp2Pool,
                                      parser->m_encoding,
                                      encodingName,
                                      encodingName
                                      + XmlNameLength(parser->m_encoding, encodingName));
      if (!storedEncName)
              return XML_ERROR_NO_MEMORY;
      poolFinish(&parser->m_temp2Pool);
    }
    if (version) {
      storedversion = poolStoreString(&parser->m_temp2Pool,
                                      parser->m_encoding,
                                      version,
                                      versionend - parser->m_encoding->minBytesPerChar);
      if (!storedversion)
        return XML_ERROR_NO_MEMORY;
    }
    parser->m_xmlDeclHandler(parser->m_handlerArg, storedversion, storedEncName, standalone);
  }
  else if (parser->m_defaultHandler)
    reportDefault(parser, parser->m_encoding, s, next);
  if (parser->m_protocolEncodingName == NULL) {
    if (newEncoding) {
      /* Check that the specified encoding does not conflict with what
       * the parser has already deduced.  Do we have the same number
       * of bytes in the smallest representation of a character?  If
       * this is UTF-16, is it the same endianness?
       */
      if (newEncoding->minBytesPerChar != parser->m_encoding->minBytesPerChar
          || (newEncoding->minBytesPerChar == 2 &&
              newEncoding != parser->m_encoding)) {
        parser->m_eventPtr = encodingName;
        return XML_ERROR_INCORRECT_ENCODING;
      }
      parser->m_encoding = newEncoding;
    }
    else if (encodingName) {
      enum XML_Error result;
      if (!storedEncName) {
        storedEncName = poolStoreString(
          &parser->m_temp2Pool, parser->m_encoding, encodingName,
          encodingName + XmlNameLength(parser->m_encoding, encodingName));
        if (!storedEncName)
          return XML_ERROR_NO_MEMORY;
      }
      result = handleUnknownEncoding(parser, storedEncName);
      poolClear(&parser->m_temp2Pool);
      if (result == XML_ERROR_UNKNOWN_ENCODING)
        parser->m_eventPtr = encodingName;
      return result;
    }
  }

  if (storedEncName || storedversion)
    poolClear(&parser->m_temp2Pool);

  return XML_ERROR_NONE;
}